

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

int __thiscall HashTable::Search(HashTable *this,Game *game)

{
  __type _Var1;
  int local_28;
  int local_24;
  int count;
  int index;
  Game *game_local;
  HashTable *this_local;
  
  _count = game;
  game_local = (Game *)this;
  local_24 = key_hash_func(this,(long)game->id,this->hashSize);
  if ((this->arrAddress[local_24] & 1U) != 0) {
    while ((this->arrAddress[local_24] & 1U) != 0) {
      local_24 = value_hash_func(this,&local_24,this->hashSize);
    }
  }
  if (this->games[local_24].id == game->id) {
    _Var1 = std::operator==(&this->games[local_24].manufacturer,&game->manufacturer);
    if ((((_Var1) && (_Var1 = std::operator==(&this->games[local_24].date,&game->date), _Var1)) &&
        (_Var1 = std::operator==(&this->games[local_24].genre,&game->genre), _Var1)) &&
       (_Var1 = std::operator==(&this->games[local_24].name,&game->name), _Var1)) {
      return local_24;
    }
    local_24 = value_hash_func(this,&game->id,this->hashSize);
    _Var1 = std::operator==(&this->games[local_24].manufacturer,&game->manufacturer);
    if (((_Var1) && (_Var1 = std::operator==(&this->games[local_24].date,&game->date), _Var1)) &&
       ((_Var1 = std::operator==(&this->games[local_24].genre,&game->genre), _Var1 &&
        (_Var1 = std::operator==(&this->games[local_24].name,&game->name), _Var1)))) {
      return local_24;
    }
    local_28 = 0;
    do {
      do {
        local_24 = value_hash_func(this,&game->id,this->hashSize);
      } while ((this->arrAddress[local_24] & 1U) != 0);
      local_28 = local_28 + 1;
      _Var1 = std::operator==(&this->games[local_24].manufacturer,&game->manufacturer);
      if (((_Var1) && (_Var1 = std::operator==(&this->games[local_24].date,&game->date), _Var1)) &&
         ((_Var1 = std::operator==(&this->games[local_24].genre,&game->genre), _Var1 &&
          (_Var1 = std::operator==(&this->games[local_24].name,&game->name), _Var1)))) {
        return local_24;
      }
    } while (local_28 != this->hashSize);
  }
  return -1;
}

Assistant:

int Search(Game game)
        {

            int index = key_hash_func(game.id, hashSize);
            if (arrAddress[index])
            {
                while (arrAddress[index])
                {
                    index = value_hash_func(index, hashSize);
                }
            }
                if (games[index].id == game.id)
                {
                    if (games[index].manufacturer == game.manufacturer && games[index].date == game.date && games[index].genre == game.genre && games[index].name == game.name)
                    {
                        return index;
                    }
                    else
                    {
                        index = value_hash_func(game.id, hashSize);
                        if (games[index].manufacturer == game.manufacturer && games[index].date == game.date && games[index].genre == game.genre && games[index].name == game.name)
                        {
                            return index;
                        }
                        int count = 0;
                        while (true)
                        {

                            index = value_hash_func(game.id, hashSize);
                            if (arrAddress[index])
                            {
                                continue;
                            }
                            else
                            {
                                count++;
                                if (games[index].manufacturer == game.manufacturer && games[index].date == game.date && games[index].genre == game.genre && games[index].name == game.name)
                                {
                                    return index;
                                }
                            }
                            if (count == hashSize)
                            {
                                break;
                            }
                        }

                    }
                }

            return -1;
        }